

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::SSLClient::verify_host_with_common_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  int iVar2;
  X509_NAME *name_00;
  char name [8192];
  
  name_00 = X509_get_subject_name((X509 *)server_cert);
  if ((name_00 != (X509_NAME *)0x0) &&
     (iVar2 = X509_NAME_get_text_by_NID(name_00,0xd,name,0x2000), iVar2 != -1)) {
    bVar1 = check_host_name(this,name,(long)iVar2);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool SSLClient::verify_host_with_common_name(X509 * server_cert) const {
        const auto subject_name = X509_get_subject_name(server_cert);

        if (subject_name != nullptr) {
            char name[BUFSIZ];
            auto name_len = X509_NAME_get_text_by_NID(subject_name, NID_commonName,
                name, sizeof(name));

            if (name_len != -1) {
                return check_host_name(name, static_cast<size_t>(name_len));
            }
        }

        return false;
    }